

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Set_tiled_irreg_proc_grid64(int g_a,int64_t *mapc,int64_t *nblocks,int64_t *proc_grid)

{
  Integer IVar1;
  Integer *mapc_00;
  long lVar2;
  Integer _proc_grid [7];
  Integer _nblocks [7];
  Integer aIStack_a8 [7];
  int64_t iStack_70;
  Integer local_68 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  mapc_00 = copy_map64(nblocks,(int)IVar1,mapc);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      (&iStack_70)[lVar2] = *nblocks;
      nblocks = nblocks + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    if (0 < IVar1) {
      do {
        aIStack_a8[IVar1 + -1] = *proc_grid;
        proc_grid = proc_grid + 1;
        IVar1 = IVar1 + -1;
      } while (IVar1 != 0);
    }
  }
  pnga_set_tiled_irreg_proc_grid((long)g_a,mapc_00,local_68,aIStack_a8);
  free(mapc_00);
  return;
}

Assistant:

void GA_Set_tiled_irreg_proc_grid64(int g_a, int64_t mapc[], int64_t nblocks[],
    int64_t proc_grid[])
{
    Integer aa, ndim;
    Integer *_ga_map_capi;
    Integer _nblocks[MAXDIM];
    Integer _proc_grid[MAXDIM];

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    _ga_map_capi = copy_map64(nblocks, (int)ndim, mapc);
    COPYC2F(nblocks,_nblocks, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);

    wnga_set_tiled_irreg_proc_grid(aa, _ga_map_capi, _nblocks, _proc_grid);
    free(_ga_map_capi);
}